

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QLayoutItem * __thiscall QDockWidgetGroupLayout::takeAt(QDockWidgetGroupLayout *this,int index)

{
  bool bVar1;
  int iVar2;
  QLayoutItem *pQVar3;
  undefined4 extraout_var;
  QList<int> *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  QLayoutItem *ret;
  QList<int> path;
  int x;
  QList<int> *in_stack_ffffffffffffff88;
  QRect *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  QDockAreaLayoutInfo *in_stack_ffffffffffffffc8;
  QDockAreaLayoutInfo *in_stack_ffffffffffffffd0;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0;
  pQVar3 = QDockAreaLayoutInfo::takeAt
                     (in_stack_ffffffffffffffd0,(int *)in_stack_ffffffffffffffc8,
                      in_stack_ffffffffffffffc4);
  bVar1 = QRect::isValid(in_stack_ffffffffffffff90);
  if ((bVar1) && (iVar2 = (*pQVar3->_vptr_QLayoutItem[0xd])(), CONCAT44(extraout_var,iVar2) != 0)) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    (*pQVar3->_vptr_QLayoutItem[0xd])();
    QDockAreaLayoutInfo::indexOf
              (in_stack_ffffffffffffffc8,
               (QWidget *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    bVar1 = QList<int>::isEmpty((QList<int> *)0x603ba9);
    if (!bVar1) {
      QDockAreaLayoutInfo::remove((QDockAreaLayoutInfo *)(in_RDI + 0x100),(char *)&local_28);
    }
    this_00 = (QList<int> *)(in_RDI + 0x90);
    (*pQVar3->_vptr_QLayoutItem[0xd])();
    QDockAreaLayoutInfo::indexOf
              (in_stack_ffffffffffffffc8,
               (QWidget *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    QList<int>::operator=(this_00,in_stack_ffffffffffffff88);
    QList<int>::~QList((QList<int> *)0x603c09);
    bVar1 = QList<int>::isEmpty((QList<int> *)0x603c13);
    if (!bVar1) {
      QDockAreaLayoutInfo::remove((QDockAreaLayoutInfo *)(in_RDI + 0x90),(char *)&local_28);
    }
    QList<int>::~QList((QList<int> *)0x603c37);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return pQVar3;
}

Assistant:

QLayoutItem* takeAt(int index) override
    {
        int x = 0;
        QLayoutItem *ret = layoutState.takeAt(&x, index);
        if (savedState.rect.isValid() && ret->widget()) {
            // we need to remove the item also from the saved state to prevent crash
            QList<int> path = savedState.indexOf(ret->widget());
            if (!path.isEmpty())
                savedState.remove(path);
            // Also, the item may be contained several times as a gap item.
            path = layoutState.indexOf(ret->widget());
            if (!path.isEmpty())
                layoutState.remove(path);
        }
        return ret;
    }